

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O3

bool cmGeneratorExpression::IsValidTargetName(string *input)

{
  bool bVar1;
  int iVar2;
  
  if (IsValidTargetName(std::__cxx11::string_const&)::targetNameValidator == '\0') {
    iVar2 = __cxa_guard_acquire(&IsValidTargetName(std::__cxx11::string_const&)::targetNameValidator
                               );
    if (iVar2 != 0) {
      IsValidTargetName::targetNameValidator.program = (char *)0x0;
      cmsys::RegularExpression::compile
                (&IsValidTargetName::targetNameValidator,"^[A-Za-z0-9_.:+-]+$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   &IsValidTargetName::targetNameValidator,&__dso_handle);
      __cxa_guard_release(&IsValidTargetName(std::__cxx11::string_const&)::targetNameValidator);
    }
  }
  bVar1 = cmsys::RegularExpression::find
                    (&IsValidTargetName::targetNameValidator,(input->_M_dataplus)._M_p);
  return bVar1;
}

Assistant:

bool cmGeneratorExpression::IsValidTargetName(const std::string& input)
{
  // The ':' is supported to allow use with IMPORTED targets. At least
  // Qt 4 and 5 IMPORTED targets use ':' as the namespace delimiter.
  static cmsys::RegularExpression targetNameValidator("^[A-Za-z0-9_.:+-]+$");

  return targetNameValidator.find(input);
}